

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ncart.hpp
# Opt level: O0

int NCART(DAM *am)

{
  iterator pvVar1;
  value_type_conflict *it;
  iterator __end1;
  iterator __begin1;
  DAM *__range1;
  int ncart;
  int local_34;
  int *local_20;
  int local_c;
  
  local_c = 1;
  local_20 = DAM::begin((DAM *)0x151a60);
  pvVar1 = DAM::end((DAM *)0x151a6f);
  for (; local_20 != pvVar1; local_20 = local_20 + 1) {
    if (*local_20 < 0) {
      local_34 = 0;
    }
    else {
      local_34 = (*local_20 + 2) * (*local_20 + 1) >> 1;
    }
    local_c = local_34 * local_c;
  }
  return local_c;
}

Assistant:

inline int NCART(DAM am)
{
    int ncart = 1;

    for(auto & it : am)
        ncart *= NCART_(it);

    return ncart;
}